

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

void decode_nvrm_ioctl_vspace_map(nvrm_ioctl_vspace_map *s)

{
  uint uVar1;
  uint32_t status;
  uint64_t uVar2;
  FILE *__stream;
  int iVar3;
  char *pcVar4;
  
  uVar1 = s->cid;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("cid");
    if (iVar3 != 0) goto LAB_00256cfa;
  }
  else {
LAB_00256cfa:
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->handle;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("handle");
    if (iVar3 != 0) goto LAB_00256d40;
  }
  else {
LAB_00256d40:
    fprintf(_stdout,"%shandle: 0x%08x",pcVar4,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  uVar1 = s->dev;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("dev");
    if (iVar3 != 0) goto LAB_00256d93;
  }
  else {
LAB_00256d93:
    fprintf(_stdout,"%sdev: 0x%08x",nvrm_pfx,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->dev,"dev");
  }
  uVar1 = s->vspace;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("vspace");
    if (iVar3 != 0) goto LAB_00256dea;
  }
  else {
LAB_00256dea:
    fprintf(_stdout,"%svspace: 0x%08x",nvrm_pfx,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->vspace,"vspace");
  }
  uVar2 = s->base;
  if (uVar2 == 0) {
    iVar3 = _nvrm_field_enabled("base");
    if (iVar3 != 0) goto LAB_00256e43;
  }
  else {
LAB_00256e43:
    fprintf(_stdout,"%sbase: 0x%016lx",nvrm_pfx,uVar2);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar2 = s->size;
  if (uVar2 == 0) {
    iVar3 = _nvrm_field_enabled("size");
    if (iVar3 != 0) goto LAB_00256e8c;
  }
  else {
LAB_00256e8c:
    fprintf(_stdout,"%ssize: 0x%016lx",pcVar4,uVar2);
    pcVar4 = nvrm_sep;
  }
  uVar1 = s->flags;
  nvrm_pfx = pcVar4;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("flags");
    if (iVar3 != 0) goto LAB_00256ecf;
  }
  else {
LAB_00256ecf:
    fprintf(_stdout,"%sflags: 0x%08x",pcVar4,(ulong)uVar1);
    pcVar4 = nvrm_sep;
  }
  if (s->_pad1 != 0) {
    nvrm_pfx = pcVar4;
    fprintf(_stdout,"%s%s_pad1: 0x%08x%s",pcVar4,colors->err,(ulong)s->_pad1,colors->reset);
    pcVar4 = nvrm_sep;
  }
  uVar2 = s->addr;
  nvrm_pfx = pcVar4;
  if (uVar2 == 0) {
    iVar3 = _nvrm_field_enabled("addr");
    if (iVar3 != 0) goto LAB_00256f56;
  }
  else {
LAB_00256f56:
    fprintf(_stdout,"%saddr: 0x%016lx",pcVar4,uVar2);
    pcVar4 = nvrm_sep;
  }
  status = s->status;
  nvrm_pfx = pcVar4;
  if (status == 0) {
    iVar3 = _nvrm_field_enabled("status");
    if (iVar3 == 0) goto LAB_00256fcc;
  }
  __stream = _stdout;
  nvrm_status(status);
  fprintf(__stream,"%sstatus: %s",pcVar4,nvrm_status::buf);
  pcVar4 = nvrm_sep;
LAB_00256fcc:
  nvrm_pfx = pcVar4;
  if (s->_pad2 != 0) {
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",pcVar4,colors->err,(ulong)s->_pad2,colors->reset);
    nvrm_pfx = nvrm_sep;
  }
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_vspace_map(struct nvrm_ioctl_vspace_map *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_handle(s, dev, cid);
	nvrm_print_handle(s, vspace, cid);
	nvrm_print_x64(s, base);
	nvrm_print_x64(s, size);
	nvrm_print_x32(s, flags);
	nvrm_print_pad_x32(s, _pad1);
	nvrm_print_x64(s, addr);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_ln();
}